

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O2

int nni_plat_ncpu(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  return (int)lVar1;
}

Assistant:

int
nni_plat_ncpu(void)
{
	// POSIX specifies sysconf exists, but not the value
	// _SC_NPROCESSORS_ONLN.  Nonetheless, everybody implements it.
	// If you don't we'll assume you only have a single logical CPU.
#ifdef _SC_NPROCESSORS_ONLN
	return (sysconf(_SC_NPROCESSORS_ONLN));
#else
	return (1);
#endif
}